

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall
r_exec::IPGMContext::copy_structure_to_value_array
          (IPGMContext *this,bool prefix,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr)

{
  ushort uVar1;
  Atom *pAVar2;
  char cVar3;
  bool bVar4;
  uint16_t uVar5;
  ushort uVar6;
  int iVar7;
  Atom *pAVar8;
  ulong uVar9;
  bool local_91;
  bool local_57;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  uint16_t i_3;
  uint16_t i_2;
  uint16_t i_1;
  uint16_t i;
  uint16_t atom_count;
  Operator local_38;
  byte local_21;
  uint16_t *puStack_20;
  bool dereference_cptr_local;
  uint16_t *extent_index_local;
  uint16_t write_index_local;
  IPGMContext *pIStack_10;
  bool prefix_local;
  IPGMContext *this_local;
  
  local_21 = dereference_cptr;
  puStack_20 = extent_index;
  extent_index_local._4_2_ = write_index;
  extent_index_local._7_1_ = prefix;
  pIStack_10 = this;
  cVar3 = r_code::Atom::getDescriptor();
  local_57 = false;
  if (cVar3 == -0x3b) {
    uVar5 = r_code::Atom::asOpcode();
    Operator::Get(&local_38,uVar5);
    local_57 = Operator::is_syn(&local_38);
    Operator::~Operator(&local_38);
  }
  if (local_57 == false) {
    iVar7 = (*(this->super__Context)._vptr__Context[6])();
    uVar6 = (ushort)iVar7;
    pAVar2 = (this->super__Context).code;
    uVar1 = (this->super__Context).index;
    uVar9 = (ulong)extent_index_local._4_2_;
    extent_index_local._4_2_ = extent_index_local._4_2_ + 1;
    pAVar8 = r_code::vector<r_code::Atom>::operator[]
                       (&((this->super__Context).overlay)->values,uVar9);
    r_code::Atom::operator=(pAVar8,pAVar2 + (ulong)uVar1 * 4);
    *puStack_20 = extent_index_local._4_2_ + uVar6;
    cVar3 = r_code::Atom::getDescriptor();
    uVar5 = extent_index_local._4_2_;
    if (cVar3 == -0x40) {
      if ((local_21 & 1) == 0) {
        extent_index_local._4_2_ = extent_index_local._4_2_ + 1;
        copy_member_to_value_array
                  (this,1,(bool)(extent_index_local._7_1_ & 1),uVar5,puStack_20,false);
        for (local_52 = 2; local_52 <= uVar6; local_52 = local_52 + 1) {
          pAVar2 = (this->super__Context).code;
          uVar1 = (this->super__Context).index;
          uVar9 = (ulong)extent_index_local._4_2_;
          extent_index_local._4_2_ = extent_index_local._4_2_ + 1;
          pAVar8 = r_code::vector<r_code::Atom>::operator[]
                             (&((this->super__Context).overlay)->values,uVar9);
          r_code::Atom::operator=(pAVar8,pAVar2 + (long)(int)((uint)uVar1 + (uint)local_52) * 4);
        }
        return;
      }
    }
    else if (cVar3 == -0x39) {
      for (local_50 = 1; local_50 <= uVar6; local_50 = local_50 + 1) {
        pAVar2 = (this->super__Context).code;
        uVar1 = (this->super__Context).index;
        uVar9 = (ulong)extent_index_local._4_2_;
        extent_index_local._4_2_ = extent_index_local._4_2_ + 1;
        pAVar8 = r_code::vector<r_code::Atom>::operator[]
                           (&((this->super__Context).overlay)->values,uVar9);
        r_code::Atom::operator=(pAVar8,pAVar2 + (long)(int)((uint)uVar1 + (uint)local_50) * 4);
      }
      return;
    }
    bVar4 = is_cmd_with_cptr(this);
    if (bVar4) {
      for (local_54 = 1; uVar5 = extent_index_local._4_2_, local_54 <= uVar6;
          local_54 = local_54 + 1) {
        extent_index_local._4_2_ = extent_index_local._4_2_ + 1;
        copy_member_to_value_array
                  (this,local_54,(bool)(extent_index_local._7_1_ & 1),uVar5,puStack_20,local_54 != 2
                  );
      }
    }
    else {
      for (local_56 = 1; uVar5 = extent_index_local._4_2_, local_56 <= uVar6;
          local_56 = local_56 + 1) {
        extent_index_local._4_2_ = extent_index_local._4_2_ + 1;
        local_91 = (local_21 & 1) == 0 && local_56 == 1;
        copy_member_to_value_array
                  (this,local_56,(bool)(extent_index_local._7_1_ & 1),uVar5,puStack_20,
                   (bool)((local_91 ^ 0xffU) & 1));
      }
    }
  }
  else {
    copy_member_to_value_array
              (this,1,(bool)(extent_index_local._7_1_ & 1),extent_index_local._4_2_,puStack_20,
               (bool)(local_21 & 1));
  }
  return;
}

Assistant:

void IPGMContext::copy_structure_to_value_array(bool prefix, uint16_t write_index, uint16_t &extent_index, bool dereference_cptr)   // prefix: by itpr or not.
{
    if (code[index].getDescriptor() == Atom::OPERATOR && Operator::Get(code[index].asOpcode()).is_syn()) {
        copy_member_to_value_array(1, prefix, write_index, extent_index, dereference_cptr);
    } else {
        uint16_t atom_count = getChildrenCount();
        overlay->values[write_index++] = code[index];
        extent_index = write_index + atom_count;

        switch (code[index].getDescriptor()) {
        case Atom::TIMESTAMP:
            for (uint16_t i = 1; i <= atom_count; ++i) {
                overlay->values[write_index++] = code[index + i];
            }

            break;

        case Atom::C_PTR:
            if (!dereference_cptr) {
                copy_member_to_value_array(1, prefix, write_index++, extent_index, false);

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    overlay->values[write_index++] = code[index + i];
                }

                //Atom::Trace(&overlay->values[0],overlay->values.size());
                break;
            } // else, dereference the c_ptr.

        default:
            if (is_cmd_with_cptr()) {
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    copy_member_to_value_array(i, prefix, write_index++, extent_index, i != 2);
                }
            } else {
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    copy_member_to_value_array(i, prefix, write_index++, extent_index, !(!dereference_cptr && i == 1));
                }
            }
        }
    }
}